

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_nbwait_notify(Integer *nbhandle)

{
  long lVar1;
  Integer *nbhandle_00;
  bool bVar2;
  
  nbhandle_00 = &putn_handles[0].elementhdl;
  lVar1 = 100;
  while( true ) {
    bVar2 = lVar1 == 0;
    lVar1 = lVar1 + -1;
    if (bVar2) {
      return;
    }
    if (((gai_putn_hdl_t *)(nbhandle_00 + -2))->orighdl == nbhandle) break;
    nbhandle_00 = nbhandle_00 + 4;
  }
  nga_wait_internal(nbhandle_00 + -1);
  nga_wait_internal(nbhandle_00);
  if ((void *)nbhandle_00[1] != (void *)0x0) {
    free((void *)nbhandle_00[1]);
    nbhandle_00[1] = 0;
  }
  ((gai_putn_hdl_t *)(nbhandle_00 + -2))->orighdl = (Integer *)0x0;
  return;
}

Assistant:

void pnga_nbwait_notify(Integer *nbhandle)
{
  int i;

  for (i = 0; i < HANDLES_OUTSTANDING; i++)
    if (putn_handles[i].orighdl == nbhandle)
      break;

  if (i >= HANDLES_OUTSTANDING)
    return; /* Incorrect handle used or maybe wait was called multiple times? */

  nga_wait_internal(&putn_handles[i].firsthdl);
  nga_wait_internal(&putn_handles[i].elementhdl);

  if (putn_handles[i].elem_copy) {
    free(putn_handles[i].elem_copy);
    putn_handles[i].elem_copy = NULL;
  }

  putn_handles[i].orighdl = NULL;
}